

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# P2PFileReceiver.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  ostringstream *poVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  size_type sVar2;
  bool bVar3;
  OutputWorker *pOVar4;
  size_t sVar5;
  char *pcVar6;
  string hostname;
  SDKJsonResult result;
  P2PFileReceiver receiver;
  string local_2b0;
  char *local_290;
  long local_288;
  char local_280 [16];
  SDKJsonResult local_270;
  undefined1 local_248 [392];
  P2PFileReceiver local_c0;
  
  local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2b0,"127.0.0.1","");
  sVar2 = local_2b0._M_string_length;
  if (argc < 2) {
    if (argc == 1) {
      pcVar6 = *argv;
    }
    else {
      pcVar6 = "P2PFileSender";
    }
    if ((int)Logger.ChannelMinLevel < 3) {
      poVar1 = (ostringstream *)(local_248 + 0x10);
      local_248._0_8_ = Logger.ChannelName;
      local_248._8_4_ = Info;
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,Logger.Prefix._M_dataplus._M_p,Logger.Prefix._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"Usage: ",7);
      if (pcVar6 == (char *)0x0) {
        std::ios::clear((int)poVar1 + (int)*(undefined8 *)(local_248._16_8_ + -0x18));
      }
      else {
        sVar5 = strlen(pcVar6);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,pcVar6,sVar5);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1," <Rendezvous Server Hostname>",0x1d);
      pOVar4 = logger::OutputWorker::GetInstance();
      logger::OutputWorker::Write(pOVar4,(LogStringBuffer *)local_248);
      goto LAB_00104568;
    }
  }
  else {
    pcVar6 = argv[1];
    strlen(pcVar6);
    std::__cxx11::string::_M_replace((ulong)&local_2b0,0,(char *)sVar2,(ulong)pcVar6);
    if ((int)Logger.ChannelMinLevel < 3) {
      poVar1 = (ostringstream *)(local_248 + 0x10);
      local_248._0_8_ = Logger.ChannelName;
      local_248._8_4_ = Info;
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,Logger.Prefix._M_dataplus._M_p,Logger.Prefix._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"Server hostname: ",0x11)
      ;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,local_2b0._M_dataplus._M_p,local_2b0._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", port: ",8);
      std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1," - Also broadcasting on the LAN to find server",0x2e);
      pOVar4 = logger::OutputWorker::GetInstance();
      logger::OutputWorker::Write(pOVar4,(LogStringBuffer *)local_248);
LAB_00104568:
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_248 + 0x10));
      std::ios_base::~ios_base((ios_base *)(local_248 + 0x80));
    }
  }
  tonk::SDKSocket::SDKSocket(&local_c0.super_SDKSocket);
  local_c0.super_SDKSocket._vptr_SDKSocket = (_func_int **)&PTR__SDKSocket_0010aa90;
  local_c0.Complete._M_base._M_i = (__atomic_base<bool>)false;
  bVar3 = P2PFileReceiver::Initialize(&local_c0);
  if (bVar3) {
    if (1 < (int)Logger.ChannelMinLevel) goto LAB_001046a6;
    poVar1 = (ostringstream *)(local_248 + 0x10);
    local_248._0_8_ = Logger.ChannelName;
    local_248._8_4_ = Debug;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,Logger.Prefix._M_dataplus._M_p,Logger.Prefix._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"File sending client started",0x1b);
    pOVar4 = logger::OutputWorker::GetInstance();
    logger::OutputWorker::Write(pOVar4,(LogStringBuffer *)local_248);
  }
  else {
    if (1 < (int)Logger.ChannelMinLevel) goto LAB_001046a6;
    poVar1 = (ostringstream *)(local_248 + 0x10);
    local_248._0_8_ = Logger.ChannelName;
    local_248._8_4_ = Debug;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,Logger.Prefix._M_dataplus._M_p,Logger.Prefix._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"File sending server failed to start",0x23);
    pOVar4 = logger::OutputWorker::GetInstance();
    logger::OutputWorker::Write(pOVar4,(LogStringBuffer *)local_248);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_248 + 0x10));
  std::ios_base::~ios_base((ios_base *)(local_248 + 0x80));
LAB_001046a6:
  local_270._0_8_ = &local_c0;
  std::__shared_ptr<FileReceiverServerConnection,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<std::allocator<FileReceiverServerConnection>,P2PFileReceiver*>
            ((__shared_ptr<FileReceiverServerConnection,(__gnu_cxx::_Lock_policy)2> *)local_248,
             (allocator<FileReceiverServerConnection> *)&local_290,(P2PFileReceiver **)&local_270);
  this = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT44(local_248._12_4_,local_248._8_4_);
  tonk::SDKSocket::Connect
            (&local_270,&local_c0.super_SDKSocket,(SDKConnection *)local_248._0_8_,&local_2b0,0x285e
            );
  if (local_270.super_SDKResult.Result != Tonk_Success) {
    local_290 = local_280;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_290,local_270.ErrorJson._M_dataplus._M_p,
               local_270.ErrorJson._M_dataplus._M_p + local_270.ErrorJson._M_string_length);
    if ((int)Logger.ChannelMinLevel < 3) {
      poVar1 = (ostringstream *)(local_248 + 0x10);
      local_248._0_8_ = Logger.ChannelName;
      local_248._8_4_ = Info;
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,Logger.Prefix._M_dataplus._M_p,Logger.Prefix._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,"Client connection failed: ",0x1a);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,local_290,local_288);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1," - Going to advertise on the LAN looking for connections",0x38);
      pOVar4 = logger::OutputWorker::GetInstance();
      logger::OutputWorker::Write(pOVar4,(LogStringBuffer *)local_248);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      std::ios_base::~ios_base((ios_base *)(local_248 + 0x80));
    }
    if (local_290 != local_280) {
      operator_delete(local_290);
    }
  }
  if (local_270.ErrorJson._M_dataplus._M_p != (pointer)((long)&local_270 + 0x18U)) {
    operator_delete(local_270.ErrorJson._M_dataplus._M_p);
  }
  getchar();
  if ((int)Logger.ChannelMinLevel < 2) {
    poVar1 = (ostringstream *)(local_248 + 0x10);
    local_248._0_8_ = Logger.ChannelName;
    local_248._8_4_ = Debug;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,Logger.Prefix._M_dataplus._M_p,Logger.Prefix._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"Client shutdown",0xf);
    pOVar4 = logger::OutputWorker::GetInstance();
    logger::OutputWorker::Write(pOVar4,(LogStringBuffer *)local_248);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base((ios_base *)(local_248 + 0x80));
  }
  if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
  }
  tonk::SDKSocket::~SDKSocket(&local_c0.super_SDKSocket);
  if ((int)Logger.ChannelMinLevel < 2) {
    poVar1 = (ostringstream *)(local_248 + 0x10);
    local_248._0_8_ = Logger.ChannelName;
    local_248._8_4_ = Debug;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,Logger.Prefix._M_dataplus._M_p,Logger.Prefix._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"Press ENTER key to terminate",0x1c);
    pOVar4 = logger::OutputWorker::GetInstance();
    logger::OutputWorker::Write(pOVar4,(LogStringBuffer *)local_248);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base((ios_base *)(local_248 + 0x80));
  }
  getchar();
  if ((int)Logger.ChannelMinLevel < 2) {
    poVar1 = (ostringstream *)(local_248 + 0x10);
    local_248._0_8_ = Logger.ChannelName;
    local_248._8_4_ = Debug;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,Logger.Prefix._M_dataplus._M_p,Logger.Prefix._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"...Key press detected.  Terminating..",0x25);
    pOVar4 = logger::OutputWorker::GetInstance();
    logger::OutputWorker::Write(pOVar4,(LogStringBuffer *)local_248);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base((ios_base *)(local_248 + 0x80));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
    operator_delete(local_2b0._M_dataplus._M_p);
  }
  return 0;
}

Assistant:

int main(int argc, char** argv)
{
    std::string hostname = "127.0.0.1";

    if (argc >= 2) {
        hostname = argv[1];
        Logger.Info("Server hostname: ", hostname, ", port: ", kFileRendezvousServerPort,
            " - Also broadcasting on the LAN to find server");
    }
    else
    {
        const char* exe = (argc > 0 ? argv[0] : "P2PFileSender");
        Logger.Info("Usage: ", exe, " <Rendezvous Server Hostname>");
    }

    {
        P2PFileReceiver receiver;

        if (receiver.Initialize()) {
            Logger.Debug("File sending client started");
        }
        else {
            Logger.Debug("File sending server failed to start");
        }

        std::shared_ptr<FileReceiverServerConnection> connection;

        {
            connection = std::make_shared<FileReceiverServerConnection>(&receiver);

            auto result = receiver.Connect(connection.get(), hostname, kFileRendezvousServerPort);

            if (result.Failed())
            {
                Logger.Info("Client connection failed: ", result.ToString(),
                    " - Going to advertise on the LAN looking for connections");
            }
        }

        ::getchar();

        Logger.Debug("Client shutdown");
    }

    Logger.Debug("Press ENTER key to terminate");

    ::getchar();

    Logger.Debug("...Key press detected.  Terminating..");

    return 0;
}